

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O3

void __thiscall Rml::ElementDocument::~ElementDocument(ElementDocument *this)

{
  ~ElementDocument(this);
  operator_delete(this,0x1e8);
  return;
}

Assistant:

ElementDocument::~ElementDocument() {}